

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt,int ch1,int ch2,xmlXPathOp op,int value,
                       int value2,int value3,void *value4,void *value5)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  xmlChar *pxVar4;
  xmlXPathStepOp *real;
  xmlXPathCompExprPtr comp;
  int value2_local;
  int value_local;
  xmlXPathOp op_local;
  int ch2_local;
  int ch1_local;
  xmlXPathParserContextPtr ctxt_local;
  
  pxVar2 = ctxt->comp;
  if (pxVar2->maxStep <= pxVar2->nbStep) {
    if (999999 < pxVar2->maxStep) {
      xmlXPathPErrMemory(ctxt,"adding step\n");
      return -1;
    }
    pxVar2->maxStep = pxVar2->maxStep << 1;
    pxVar3 = (xmlXPathStepOp *)(*xmlRealloc)(pxVar2->steps,(long)pxVar2->maxStep * 0x38);
    if (pxVar3 == (xmlXPathStepOp *)0x0) {
      pxVar2->maxStep = pxVar2->maxStep / 2;
      xmlXPathPErrMemory(ctxt,"adding step\n");
      return -1;
    }
    pxVar2->steps = pxVar3;
  }
  pxVar2->last = pxVar2->nbStep;
  pxVar2->steps[pxVar2->nbStep].ch1 = ch1;
  pxVar2->steps[pxVar2->nbStep].ch2 = ch2;
  pxVar2->steps[pxVar2->nbStep].op = op;
  pxVar2->steps[pxVar2->nbStep].value = value;
  pxVar2->steps[pxVar2->nbStep].value2 = value2;
  pxVar2->steps[pxVar2->nbStep].value3 = value3;
  if ((pxVar2->dict == (xmlDictPtr)0x0) ||
     (((op != XPATH_OP_FUNCTION && (op != XPATH_OP_VARIABLE)) && (op != XPATH_OP_COLLECT)))) {
    pxVar2->steps[pxVar2->nbStep].value4 = value4;
    pxVar2->steps[pxVar2->nbStep].value5 = value5;
  }
  else {
    if (value4 == (void *)0x0) {
      pxVar2->steps[pxVar2->nbStep].value4 = (void *)0x0;
    }
    else {
      pxVar4 = xmlDictLookup(pxVar2->dict,(xmlChar *)value4,-1);
      pxVar2->steps[pxVar2->nbStep].value4 = pxVar4;
      (*xmlFree)(value4);
    }
    if (value5 == (void *)0x0) {
      pxVar2->steps[pxVar2->nbStep].value5 = (void *)0x0;
    }
    else {
      pxVar4 = xmlDictLookup(pxVar2->dict,(xmlChar *)value5,-1);
      pxVar2->steps[pxVar2->nbStep].value5 = pxVar4;
      (*xmlFree)(value5);
    }
  }
  pxVar2->steps[pxVar2->nbStep].cache = (xmlXPathFunction)0x0;
  iVar1 = pxVar2->nbStep;
  pxVar2->nbStep = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt, int ch1, int ch2,
   xmlXPathOp op, int value,
   int value2, int value3, void *value4, void *value5) {
    xmlXPathCompExprPtr comp = ctxt->comp;
    if (comp->nbStep >= comp->maxStep) {
	xmlXPathStepOp *real;

        if (comp->maxStep >= XPATH_MAX_STEPS) {
	    xmlXPathPErrMemory(ctxt, "adding step\n");
	    return(-1);
        }
	comp->maxStep *= 2;
	real = (xmlXPathStepOp *) xmlRealloc(comp->steps,
		                      comp->maxStep * sizeof(xmlXPathStepOp));
	if (real == NULL) {
	    comp->maxStep /= 2;
	    xmlXPathPErrMemory(ctxt, "adding step\n");
	    return(-1);
	}
	comp->steps = real;
    }
    comp->last = comp->nbStep;
    comp->steps[comp->nbStep].ch1 = ch1;
    comp->steps[comp->nbStep].ch2 = ch2;
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->steps[comp->nbStep].value3 = value3;
    if ((comp->dict != NULL) &&
        ((op == XPATH_OP_FUNCTION) || (op == XPATH_OP_VARIABLE) ||
	 (op == XPATH_OP_COLLECT))) {
        if (value4 != NULL) {
	    comp->steps[comp->nbStep].value4 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value4, -1);
	    xmlFree(value4);
	} else
	    comp->steps[comp->nbStep].value4 = NULL;
        if (value5 != NULL) {
	    comp->steps[comp->nbStep].value5 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value5, -1);
	    xmlFree(value5);
	} else
	    comp->steps[comp->nbStep].value5 = NULL;
    } else {
	comp->steps[comp->nbStep].value4 = value4;
	comp->steps[comp->nbStep].value5 = value5;
    }
    comp->steps[comp->nbStep].cache = NULL;
    return(comp->nbStep++);
}